

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* jsonnet::internal::jsonnet_vm_execute_stream
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,Allocator *alloc,AST *ast,ExtMap *ext_vars,uint max_stack,
            double gc_min_objects,double gc_growth_trigger,VmNativeCallbackMap *natives,
            JsonnetImportCallback *import_callback,void *ctx,bool string_output)

{
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar1;
  HeapEntity *context;
  long lVar2;
  pointer pcVar3;
  LocationRange *pLVar4;
  Location *pLVar5;
  ostream *poVar6;
  RuntimeError *__return_storage_ptr___00;
  size_type *psVar7;
  Type t;
  _func_int **pp_Var8;
  LocationRange loc;
  stringstream ss;
  Interpreter vm;
  undefined1 local_438 [8];
  UString *pUStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_428;
  _Base_ptr local_418;
  size_t local_410;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_408;
  UString local_400;
  _func_int **local_3e0;
  LocationRange local_3d8;
  undefined1 local_398 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  unsigned_long local_378;
  unsigned_long uStack_370;
  unsigned_long local_368;
  unsigned_long uStack_360;
  undefined1 local_210 [72];
  anon_union_8_3_4e909c26_for_v aStack_1c8;
  Stack local_1c0 [10];
  
  anon_unknown_0::Interpreter::Interpreter
            ((Interpreter *)local_210,alloc,ext_vars,max_stack,gc_min_objects,gc_growth_trigger,
             natives,import_callback,ctx);
  anon_unknown_0::Interpreter::evaluate((Interpreter *)local_210,ast,0);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398._0_8_ = local_398 + 0x10;
  local_438 = (undefined1  [8])0x14;
  local_408 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              __return_storage_ptr__;
  local_398._0_8_ = std::__cxx11::string::_M_create((ulong *)local_398,(ulong)local_438);
  local_388._M_allocated_capacity = (size_type)local_438;
  builtin_strncpy((char *)local_398._0_8_,"During manifestation",0x14);
  local_398._8_8_ = local_438;
  *(char *)(local_398._0_8_ + (long)local_438) = '\0';
  local_3d8.file._M_dataplus._M_p = (pointer)&local_3d8.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d8,local_398._0_8_,(char *)((long)local_438 + local_398._0_8_));
  local_3d8.end.line = 0;
  local_3d8.end.column = 0;
  local_3d8.begin.line = 0;
  local_3d8.begin.column = 0;
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
  }
  if (local_210._64_4_ == ARRAY) {
    pp_Var8 = aStack_1c8.h[1]._vptr_HeapEntity;
    local_3e0 = *(_func_int ***)&aStack_1c8.h[1].mark;
    if (pp_Var8 != local_3e0) {
      paVar1 = &local_400.field_2;
      do {
        context = (HeapEntity *)*pp_Var8;
        lVar2 = *(long *)&context[6].mark;
        pLVar4 = (LocationRange *)(lVar2 + 8);
        if (lVar2 == 0) {
          pLVar4 = &local_3d8;
        }
        local_398._0_8_ = local_398 + 0x10;
        pcVar3 = (pLVar4->file)._M_dataplus._M_p;
        psVar7 = (size_type *)(lVar2 + 0x10);
        if (lVar2 == 0) {
          psVar7 = &local_3d8.file._M_string_length;
        }
        std::__cxx11::string::_M_construct<char*>((string *)local_398,pcVar3,pcVar3 + *psVar7);
        __return_storage_ptr__ =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_408;
        pLVar5 = (Location *)(lVar2 + 0x28);
        if (lVar2 == 0) {
          pLVar5 = &local_3d8.begin;
        }
        local_378 = pLVar5->line;
        uStack_370 = pLVar5->column;
        local_368 = pLVar5[1].line;
        uStack_360 = pLVar5[1].column;
        if (context->field_0xa == '\x01') {
          local_438 = (undefined1  [8])0x0;
          pUStack_430 = (UString *)0x0;
          local_428._M_allocated_capacity = 0;
          local_428._8_8_ = &pUStack_430;
          local_410 = 0;
          pLVar4 = &local_3d8;
          local_418 = (_Base_ptr)local_428._8_8_;
          anon_unknown_0::Stack::newCall
                    ((Stack *)(local_210 + 0x50),pLVar4,context,(HeapObject *)0x0,0,
                     (BindingFrame *)local_438);
          std::
          _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                      *)local_428._M_allocated_capacity,(_Link_type)pLVar4);
          *(undefined8 *)
           &local_1c0[0].stack.
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].val = local_210._64_8_;
          local_1c0[0].stack.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].val.v.h = (HeapEntity *)aStack_1c8;
          local_210._64_8_ = context[1]._vptr_HeapEntity;
          aStack_1c8 = *(anon_union_8_3_4e909c26_for_v *)&context[1].mark;
        }
        else {
          anon_unknown_0::Stack::newCall
                    ((Stack *)(local_210 + 0x50),&local_3d8,context,*(HeapObject **)&context[5].mark
                     ,*(uint *)&context[6]._vptr_HeapEntity,(BindingFrame *)&context[2].mark);
          *(undefined8 *)
           &local_1c0[0].stack.
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].val = local_210._64_8_;
          local_1c0[0].stack.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].val.v.h = (HeapEntity *)aStack_1c8;
          anon_unknown_0::Interpreter::evaluate
                    ((Interpreter *)local_210,*(AST **)&context[6].mark,
                     (int)((ulong)((long)local_1c0[0].stack.
                                         super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1c0[0].stack.
                                        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x3d70a3d7);
        }
        if (string_output) {
          (anonymous_namespace)::Interpreter::manifestString_abi_cxx11_
                    ((UString *)local_438,(Interpreter *)local_210,(LocationRange *)local_398);
        }
        else {
          local_400._M_string_length = 0;
          local_400.field_2._M_local_buf[0] = L'\0';
          local_400._M_dataplus._M_p = (pointer)paVar1;
          anon_unknown_0::Interpreter::manifestJson
                    ((UString *)local_438,(Interpreter *)local_210,(LocationRange *)local_398,true,
                     &local_400);
          if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
               *)local_400._M_dataplus._M_p != paVar1) {
            operator_delete(local_400._M_dataplus._M_p,
                            CONCAT44(local_400.field_2._M_local_buf[1],
                                     local_400.field_2._M_local_buf[0]) * 4 + 4);
          }
        }
        local_210._64_8_ =
             *(undefined8 *)
              &local_1c0[0].stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].val;
        aStack_1c8 = local_1c0[0].stack.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].val.v;
        if (local_1c0[0].stack.
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].kind == FRAME_CALL) {
          local_1c0[0].calls = local_1c0[0].calls - 1;
        }
        local_1c0[0].stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1c0[0].stack.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        anon_unknown_0::Frame::~Frame
                  (local_1c0[0].stack.
                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        encode_utf8((string *)&local_400,(internal *)local_438,pUStack_430);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_400);
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_400._M_dataplus._M_p != paVar1) {
          operator_delete(local_400._M_dataplus._M_p,
                          CONCAT44(local_400.field_2._M_local_buf[1],
                                   local_400.field_2._M_local_buf[0]) + 1);
        }
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,local_428._M_allocated_capacity * 4 + 4);
        }
        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
          operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
        }
        pp_Var8 = pp_Var8 + 1;
      } while (pp_Var8 != local_3e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.file._M_dataplus._M_p != &local_3d8.file.field_2) {
      operator_delete(local_3d8.file._M_dataplus._M_p,
                      local_3d8.file.field_2._M_allocated_capacity + 1);
    }
    anon_unknown_0::Interpreter::~Interpreter((Interpreter *)local_210);
    return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_398);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_398 + 0x10),"stream mode: top-level object was a ",0x24);
  (anonymous_namespace)::type_str_abi_cxx11_
            ((string *)local_438,(_anonymous_namespace_ *)(local_210._64_8_ & 0xffffffff),t);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_398 + 0x10),(char *)local_438,(long)pUStack_430);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"should be an array whose elements hold ",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"the JSON for each document in the stream.",0x29);
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  __return_storage_ptr___00 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  anon_unknown_0::Stack::makeError
            (__return_storage_ptr___00,(Stack *)(local_210 + 0x50),&local_3d8,(string *)local_438);
  __cxa_throw(__return_storage_ptr___00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

std::vector<std::string> jsonnet_vm_execute_stream(Allocator *alloc, const AST *ast,
                                                   const ExtMap &ext_vars, unsigned max_stack,
                                                   double gc_min_objects, double gc_growth_trigger,
                                                   const VmNativeCallbackMap &natives,
                                                   JsonnetImportCallback *import_callback,
                                                   void *ctx, bool string_output)
{
    Interpreter vm(alloc,
                   ext_vars,
                   max_stack,
                   gc_min_objects,
                   gc_growth_trigger,
                   natives,
                   import_callback,
                   ctx);
    vm.evaluate(ast, 0);
    return vm.manifestStream(string_output);
}